

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalScheduling.cpp
# Opt level: O0

void __thiscall WeightedInterval::WeightedInterval(WeightedInterval *this,int s,int e,double sc)

{
  double sc_local;
  int e_local;
  int s_local;
  WeightedInterval *this_local;
  
  if (s < e) {
    this->start = s;
    this->end = e;
  }
  else {
    this->start = e;
    this->end = s;
  }
  this->score = sc;
  return;
}

Assistant:

WeightedInterval::WeightedInterval(int s, int e, double sc) {
    if (s < e) {
        start = s;
        end = e;
    } else {
        start = e;
        end = s;
    }
    score = sc;
}